

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> * __thiscall
capnp::compiler::NodeTranslator::compileAnnotationApplications
          (Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *__return_storage_ptr__,
          NodeTranslator *this,Reader annotations,StringPtr targetsFlagName)

{
  ErrorReporter *pEVar1;
  Resolver *pRVar2;
  Reader source;
  Reader type;
  Reader source_00;
  Reader name_00;
  Reader name_01;
  Reader name_02;
  Reader name_03;
  Builder target;
  Reader type_00;
  ImplicitParams implicitMethodParams;
  Builder target_00;
  undefined8 uVar3;
  ReaderFor<bool> RVar4;
  bool bVar5;
  Which WVar6;
  uint uVar7;
  NullableValue<capnp::compiler::BrandedDecl> *other;
  BrandedDecl *pBVar8;
  NullableValue<capnp::compiler::Declaration::Which> *other_00;
  Which *pWVar9;
  uint64_t uVar10;
  NullableValue<capnp::Schema> *other_01;
  Schema *pSVar11;
  Reader *value_00;
  char (*in_R8) [49];
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  StructDataBitCount SVar18;
  undefined4 uVar19;
  BrandedDecl *pBVar20;
  String local_798;
  String local_780;
  ArrayPtr<const_char> local_768;
  Maybe<capnp::Schema> local_758;
  Builder local_748;
  Reader local_720;
  Reader local_6f0;
  Builder local_6c0;
  Reader local_698;
  undefined8 local_668;
  String local_638;
  String local_620;
  ArrayPtr<const_char> local_608;
  Builder local_5f0;
  Reader local_5c8;
  undefined1 local_598 [8];
  Reader value;
  String local_538;
  String local_520;
  ArrayPtr<const_char> local_508;
  char *local_4f8;
  size_t sStack_4f0;
  ReaderFor<DynamicTypeFor<FromReader<Reader_&>_>_> local_4e0;
  Reader local_4a8;
  Reader local_460;
  undefined1 local_430 [8];
  Reader node;
  Schema *annotationSchema;
  Reader local_3d0;
  Maybe<capnp::Schema> local_3a0;
  undefined1 local_390 [8];
  NullableValue<capnp::Schema> _annotationSchema2420;
  String local_348;
  String local_330;
  ArrayPtr<const_char> local_318;
  Which *local_308;
  Which *kind;
  undefined1 auStack_2f8 [4];
  NullableValue<capnp::compiler::Declaration::Which> _kind2411;
  BrandedDecl *decl;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  Maybe<capnp::compiler::BrandedDecl> local_280;
  undefined1 local_1d0 [8];
  NullableValue<capnp::compiler::BrandedDecl> _decl2410;
  Reader name;
  Builder local_e8;
  undefined1 local_c0 [8];
  Builder annotationBuilder;
  Reader annotation;
  uint i;
  undefined1 local_58 [8];
  BuilderFor<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> builder;
  NodeTranslator *this_local;
  StringPtr targetsFlagName_local;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *result;
  
  uVar7 = List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::size
                    (&annotations);
  if ((uVar7 == 0) || ((this->compileAnnotations & 1U) == 0)) {
    memset(__return_storage_ptr__,0,0x20);
    Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_>::Orphan(__return_storage_ptr__);
  }
  else {
    builder.builder._39_1_ = 0;
    uVar7 = List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::size
                      (&annotations);
    Orphanage::newOrphan<capnp::List<capnp::schema::Annotation,(capnp::Kind)3>>
              (__return_storage_ptr__,&this->orphanage,uVar7);
    Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_>::get
              ((BuilderFor<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)local_58,
               __return_storage_ptr__);
    for (annotation._reader.nestingLimit = 0;
        uVar7 = List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::
                size(&annotations), (uint)annotation._reader.nestingLimit < uVar7;
        annotation._reader.nestingLimit = annotation._reader.nestingLimit + 1) {
      List<capnp::compiler::Declaration::AnnotationApplication,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)&annotationBuilder._builder.dataSize,&annotations,
                 annotation._reader.nestingLimit);
      List<capnp::schema::Annotation,_(capnp::Kind)3>::Builder::operator[]
                ((Builder *)local_c0,(Builder *)local_58,annotation._reader.nestingLimit);
      capnp::schema::Annotation::Builder::initValue(&local_e8,(Builder *)local_c0);
      capnp::schema::Value::Builder::setVoid(&local_e8);
      Declaration::AnnotationApplication::Reader::getName
                ((Reader *)&_decl2410.field_1.value.source._reader.nestingLimit,
                 (Reader *)&annotationBuilder._builder.dataSize);
      uVar3 = _decl2410.field_1._160_8_;
      ImplicitParams::none();
      uVar16 = SUB84(name._reader.pointers,0);
      uVar17 = (undefined4)((ulong)name._reader.pointers >> 0x20);
      SVar18 = name._reader.dataSize;
      uVar19 = name._reader._36_4_;
      uVar12 = SUB84(name._reader.capTable,0);
      uVar13 = (undefined4)((ulong)name._reader.capTable >> 0x20);
      uVar14 = SUB84(name._reader.data,0);
      uVar15 = (undefined4)((ulong)name._reader.data >> 0x20);
      source._reader.capTable._0_4_ = (int)name._reader.segment;
      source._reader.segment = (SegmentReader *)uVar3;
      source._reader.capTable._4_4_ = (int)((ulong)name._reader.segment >> 0x20);
      source._reader.data._0_4_ = uVar12;
      source._reader.data._4_4_ = uVar13;
      source._reader.pointers._0_4_ = uVar14;
      source._reader.pointers._4_4_ = uVar15;
      source._reader.dataSize = uVar16;
      source._reader._36_4_ = uVar17;
      source._reader.nestingLimit = SVar18;
      source._reader._44_4_ = uVar19;
      implicitMethodParams.params.reader.segment = (SegmentReader *)uStack_2e8;
      implicitMethodParams.scopeId = (uint64_t)decl;
      implicitMethodParams.params.reader.capTable = (CapTableReader *)local_2e0;
      implicitMethodParams.params.reader.ptr = (byte *)uStack_2d8;
      implicitMethodParams.params.reader._24_8_ = local_2d0;
      implicitMethodParams.params.reader._32_8_ = uStack_2c8;
      implicitMethodParams.params.reader._40_8_ = local_2c0;
      pBVar20 = decl;
      compileDeclExpression(&local_280,this,source,implicitMethodParams);
      other = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_280);
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
                ((NullableValue<capnp::compiler::BrandedDecl> *)local_1d0,other);
      kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_280);
      pBVar8 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_1d0);
      if (pBVar8 != (BrandedDecl *)0x0) {
        _auStack_2f8 = kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                                 ((NullableValue<capnp::compiler::BrandedDecl> *)local_1d0);
        BrandedDecl::getKind((BrandedDecl *)&kind);
        other_00 = kj::_::readMaybe<capnp::compiler::Declaration::Which>
                             ((Maybe<capnp::compiler::Declaration::Which> *)&kind);
        kj::_::NullableValue<capnp::compiler::Declaration::Which>::NullableValue
                  ((NullableValue<capnp::compiler::Declaration::Which> *)((long)&kind + 4),other_00)
        ;
        kj::Maybe<capnp::compiler::Declaration::Which>::~Maybe
                  ((Maybe<capnp::compiler::Declaration::Which> *)&kind);
        pWVar9 = kj::_::NullableValue::operator_cast_to_Which_((NullableValue *)((long)&kind + 4));
        if (pWVar9 == (Which *)0x0) {
          pEVar1 = this->errorReporter;
          name_03._reader.capTable._0_4_ = uVar12;
          name_03._reader.segment = name._reader.segment;
          name_03._reader.capTable._4_4_ = uVar13;
          name_03._reader.data._0_4_ = uVar14;
          name_03._reader.data._4_4_ = uVar15;
          name_03._reader.pointers._0_4_ = uVar16;
          name_03._reader.pointers._4_4_ = uVar17;
          name_03._reader.dataSize = SVar18;
          name_03._reader._36_4_ = uVar19;
          name_03._reader._40_8_ = pBVar20;
          expressionString(name_03);
          kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                    (&local_780,(kj *)0x2d7cf1,(char (*) [2])&local_798,
                     (String *)"\' is not an annotation.",(char (*) [24])in_R8);
          kj::StringPtr::StringPtr((StringPtr *)&local_768,&local_780);
          ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                    (pEVar1,(Reader *)&_decl2410.field_1.value.source._reader.nestingLimit,
                     (StringPtr)local_768);
          kj::String::~String(&local_780);
          kj::String::~String(&local_798);
        }
        else {
          local_308 = kj::_::NullableValue<capnp::compiler::Declaration::Which>::operator*
                                ((NullableValue<capnp::compiler::Declaration::Which> *)
                                 ((long)&kind + 4));
          if (*local_308 == ANNOTATION) {
            _annotationSchema2420.field_1 =
                 (anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2)local_c0;
            uVar10 = BrandedDecl::
                     getIdAndFillBrand<capnp::compiler::NodeTranslator::compileAnnotationApplications(capnp::List<capnp::compiler::Declaration::AnnotationApplication,(capnp::Kind)3>::Reader,kj::StringPtr)::__0>
                               ((BrandedDecl *)_auStack_2f8,
                                (Type *)&_annotationSchema2420.field_1.value);
            capnp::schema::Annotation::Builder::setId((Builder *)local_c0,uVar10);
            pRVar2 = this->resolver;
            uVar10 = capnp::schema::Annotation::Builder::getId((Builder *)local_c0);
            capnp::schema::Annotation::Builder::getBrand
                      ((Builder *)&annotationSchema,(Builder *)local_c0);
            capnp::schema::Brand::Builder::operator_cast_to_Reader
                      (&local_3d0,(Builder *)&annotationSchema);
            (*pRVar2->_vptr_Resolver[6])(&local_3a0,pRVar2,uVar10);
            other_01 = kj::_::readMaybe<capnp::Schema>(&local_3a0);
            kj::_::NullableValue<capnp::Schema>::NullableValue
                      ((NullableValue<capnp::Schema> *)local_390,other_01);
            kj::Maybe<capnp::Schema>::~Maybe(&local_3a0);
            pSVar11 = kj::_::NullableValue::operator_cast_to_Schema_((NullableValue *)local_390);
            if (pSVar11 != (Schema *)0x0) {
              node._reader._40_8_ =
                   kj::_::NullableValue<capnp::Schema>::operator*
                             ((NullableValue<capnp::Schema> *)local_390);
              Schema::getProto(&local_460,(Schema *)node._reader._40_8_);
              capnp::schema::Node::Reader::getAnnotation((Reader *)local_430,&local_460);
              toDynamic<capnp::schema::Node::Annotation::Reader&>
                        (&local_4e0,(capnp *)local_430,value_00);
              local_4f8 = targetsFlagName.content.ptr;
              sStack_4f0 = targetsFlagName.content.size_;
              DynamicStruct::Reader::get(&local_4a8,&local_4e0,targetsFlagName);
              RVar4 = DynamicValue::Reader::as<bool>(&local_4a8);
              DynamicValue::Reader::~Reader(&local_4a8);
              if (!RVar4) {
                pEVar1 = this->errorReporter;
                value._reader._40_8_ = _decl2410.field_1._160_8_;
                name_01._reader.capTable._0_4_ = uVar12;
                name_01._reader.segment = name._reader.segment;
                name_01._reader.capTable._4_4_ = uVar13;
                name_01._reader.data._0_4_ = uVar14;
                name_01._reader.data._4_4_ = uVar15;
                name_01._reader.pointers._0_4_ = uVar16;
                name_01._reader.pointers._4_4_ = uVar17;
                name_01._reader.dataSize = SVar18;
                name_01._reader._36_4_ = uVar19;
                name_01._reader._40_8_ = pBVar20;
                expressionString(name_01);
                kj::str<char_const(&)[2],kj::String,char_const(&)[49]>
                          (&local_520,(kj *)0x2d7cf1,(char (*) [2])&local_538,
                           (String *)"\' cannot be applied to this kind of declaration.",in_R8);
                kj::StringPtr::StringPtr((StringPtr *)&local_508,&local_520);
                ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                          (pEVar1,(Reader *)&_decl2410.field_1.value.source._reader.nestingLimit,
                           (StringPtr)local_508);
                kj::String::~String(&local_520);
                kj::String::~String(&local_538);
              }
              Declaration::AnnotationApplication::Reader::getValue
                        ((Reader *)local_598,(Reader *)&annotationBuilder._builder.dataSize);
              WVar6 = Declaration::AnnotationApplication::Value::Reader::which((Reader *)local_598);
              if (WVar6 == NONE) {
                capnp::schema::Node::Annotation::Reader::getType(&local_5c8,(Reader *)local_430);
                bVar5 = capnp::schema::Type::Reader::isVoid(&local_5c8);
                if (bVar5) {
                  capnp::schema::Annotation::Builder::getValue(&local_5f0,(Builder *)local_c0);
                  capnp::schema::Value::Builder::setVoid(&local_5f0);
                }
                else {
                  pEVar1 = this->errorReporter;
                  local_668 = _decl2410.field_1._160_8_;
                  name_02._reader.capTable._0_4_ = uVar12;
                  name_02._reader.segment = name._reader.segment;
                  name_02._reader.capTable._4_4_ = uVar13;
                  name_02._reader.data._0_4_ = uVar14;
                  name_02._reader.data._4_4_ = uVar15;
                  name_02._reader.pointers._0_4_ = uVar16;
                  name_02._reader.pointers._4_4_ = uVar17;
                  name_02._reader.dataSize = SVar18;
                  name_02._reader._36_4_ = uVar19;
                  name_02._reader._40_8_ = pBVar20;
                  expressionString(name_02);
                  kj::str<char_const(&)[2],kj::String,char_const(&)[20]>
                            (&local_620,(kj *)0x2d7cf1,(char (*) [2])&local_638,
                             (String *)"\' requires a value.",(char (*) [20])in_R8);
                  kj::StringPtr::StringPtr((StringPtr *)&local_608,&local_620);
                  ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                            (pEVar1,(Reader *)&_decl2410.field_1.value.source._reader.nestingLimit,
                             (StringPtr)local_608);
                  kj::String::~String(&local_620);
                  kj::String::~String(&local_638);
                  capnp::schema::Node::Annotation::Reader::getType(&local_698,(Reader *)local_430);
                  capnp::schema::Annotation::Builder::getValue(&local_6c0,(Builder *)local_c0);
                  type._reader.capTable._0_4_ = (int)local_698._reader.capTable;
                  type._reader.segment = local_698._reader.segment;
                  type._reader.capTable._4_4_ = (int)((ulong)local_698._reader.capTable >> 0x20);
                  type._reader.data._0_4_ = (int)local_698._reader.data;
                  type._reader.data._4_4_ = (int)((ulong)local_698._reader.data >> 0x20);
                  type._reader.pointers._0_4_ = (int)local_698._reader.pointers;
                  type._reader.pointers._4_4_ = (int)((ulong)local_698._reader.pointers >> 0x20);
                  type._reader.dataSize = local_698._reader.dataSize;
                  type._reader._36_4_ = local_698._reader._36_4_;
                  type._reader.nestingLimit = local_698._reader.nestingLimit;
                  type._reader._44_4_ = local_698._reader._44_4_;
                  target._builder.capTable = local_6c0._builder.capTable;
                  target._builder.segment = local_6c0._builder.segment;
                  target._builder.data = local_6c0._builder.data;
                  target._builder.pointers = local_6c0._builder.pointers;
                  target._builder.dataSize = local_6c0._builder.dataSize;
                  target._builder.pointerCount = local_6c0._builder.pointerCount;
                  target._builder._38_2_ = local_6c0._builder._38_2_;
                  compileDefaultDefaultValue(this,type,target);
                }
              }
              else if (WVar6 == EXPRESSION) {
                Declaration::AnnotationApplication::Value::Reader::getExpression
                          (&local_6f0,(Reader *)local_598);
                capnp::schema::Node::Annotation::Reader::getType(&local_720,(Reader *)local_430);
                capnp::schema::Annotation::Builder::getValue(&local_748,(Builder *)local_c0);
                kj::Maybe<capnp::Schema>::Maybe(&local_758,(Schema *)node._reader._40_8_);
                source_00._reader.capTable._0_4_ = (int)local_6f0._reader.capTable;
                source_00._reader.segment = local_6f0._reader.segment;
                source_00._reader.capTable._4_4_ = (int)((ulong)local_6f0._reader.capTable >> 0x20);
                source_00._reader.data._0_4_ = (int)local_6f0._reader.data;
                source_00._reader.data._4_4_ = (int)((ulong)local_6f0._reader.data >> 0x20);
                source_00._reader.pointers._0_4_ = (int)local_6f0._reader.pointers;
                source_00._reader.pointers._4_4_ = (int)((ulong)local_6f0._reader.pointers >> 0x20);
                source_00._reader.dataSize = local_6f0._reader.dataSize;
                source_00._reader._36_4_ = local_6f0._reader._36_4_;
                source_00._reader.nestingLimit = local_6f0._reader.nestingLimit;
                source_00._reader._44_4_ = local_6f0._reader._44_4_;
                type_00._reader.capTable = local_720._reader.capTable;
                type_00._reader.segment = local_720._reader.segment;
                type_00._reader.data = local_720._reader.data;
                type_00._reader.pointers = local_720._reader.pointers;
                type_00._reader.dataSize = local_720._reader.dataSize;
                type_00._reader.pointerCount = local_720._reader.pointerCount;
                type_00._reader._38_2_ = local_720._reader._38_2_;
                type_00._reader.nestingLimit = local_720._reader.nestingLimit;
                type_00._reader._44_4_ = local_720._reader._44_4_;
                target_00._builder.capTable = local_748._builder.capTable;
                target_00._builder.segment = local_748._builder.segment;
                target_00._builder.data = local_748._builder.data;
                target_00._builder.pointers = local_748._builder.pointers;
                target_00._builder.dataSize = local_748._builder.dataSize;
                target_00._builder.pointerCount = local_748._builder.pointerCount;
                target_00._builder._38_2_ = local_748._builder._38_2_;
                compileBootstrapValue(this,source_00,type_00,target_00,&local_758);
                kj::Maybe<capnp::Schema>::~Maybe(&local_758);
              }
            }
            kj::_::NullableValue<capnp::Schema>::~NullableValue
                      ((NullableValue<capnp::Schema> *)local_390);
          }
          else {
            pEVar1 = this->errorReporter;
            name_00._reader.capTable._0_4_ = uVar12;
            name_00._reader.segment = name._reader.segment;
            name_00._reader.capTable._4_4_ = uVar13;
            name_00._reader.data._0_4_ = uVar14;
            name_00._reader.data._4_4_ = uVar15;
            name_00._reader.pointers._0_4_ = uVar16;
            name_00._reader.pointers._4_4_ = uVar17;
            name_00._reader.dataSize = SVar18;
            name_00._reader._36_4_ = uVar19;
            name_00._reader._40_8_ = pBVar20;
            expressionString(name_00);
            kj::str<char_const(&)[2],kj::String,char_const(&)[24]>
                      (&local_330,(kj *)0x2d7cf1,(char (*) [2])&local_348,
                       (String *)"\' is not an annotation.",(char (*) [24])in_R8);
            kj::StringPtr::StringPtr((StringPtr *)&local_318,&local_330);
            ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                      (pEVar1,(Reader *)&_decl2410.field_1.value.source._reader.nestingLimit,
                       (StringPtr)local_318);
            kj::String::~String(&local_330);
            kj::String::~String(&local_348);
          }
        }
        kj::_::NullableValue<capnp::compiler::Declaration::Which>::~NullableValue
                  ((NullableValue<capnp::compiler::Declaration::Which> *)((long)&kind + 4));
      }
      kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
                ((NullableValue<capnp::compiler::BrandedDecl> *)local_1d0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Orphan<List<schema::Annotation>> NodeTranslator::compileAnnotationApplications(
    List<Declaration::AnnotationApplication>::Reader annotations,
    kj::StringPtr targetsFlagName) {
  if (annotations.size() == 0 || !compileAnnotations) {
    // Return null.
    return Orphan<List<schema::Annotation>>();
  }

  auto result = orphanage.newOrphan<List<schema::Annotation>>(annotations.size());
  auto builder = result.get();

  for (uint i = 0; i < annotations.size(); i++) {
    Declaration::AnnotationApplication::Reader annotation = annotations[i];
    schema::Annotation::Builder annotationBuilder = builder[i];

    // Set the annotation's value to void in case we fail to produce something better below.
    annotationBuilder.initValue().setVoid();

    auto name = annotation.getName();
    KJ_IF_SOME(decl, compileDeclExpression(name, ImplicitParams::none())) {
      KJ_IF_SOME(kind, decl.getKind()) {
        if (kind != Declaration::ANNOTATION) {
          errorReporter.addErrorOn(name, kj::str(
              "'", expressionString(name), "' is not an annotation."));
        } else {
          annotationBuilder.setId(decl.getIdAndFillBrand(
              [&]() { return annotationBuilder.initBrand(); }));
          KJ_IF_SOME(annotationSchema,
                      resolver.resolveBootstrapSchema(annotationBuilder.getId(),
                                                      annotationBuilder.getBrand())) {
            auto node = annotationSchema.getProto().getAnnotation();
            if (!toDynamic(node).get(targetsFlagName).as<bool>()) {
              errorReporter.addErrorOn(name, kj::str(
                  "'", expressionString(name), "' cannot be applied to this kind of declaration."));
            }

            // Interpret the value.
            auto value = annotation.getValue();
            switch (value.which()) {
              case Declaration::AnnotationApplication::Value::NONE:
                // No value, i.e. void.
                if (node.getType().isVoid()) {
                  annotationBuilder.getValue().setVoid();
                } else {
                  errorReporter.addErrorOn(name, kj::str(
                      "'", expressionString(name), "' requires a value."));
                  compileDefaultDefaultValue(node.getType(), annotationBuilder.getValue());
                }
                break;

              case Declaration::AnnotationApplication::Value::EXPRESSION:
                compileBootstrapValue(value.getExpression(), node.getType(),
                                      annotationBuilder.getValue(),
                                      annotationSchema);
                break;
            }
          }
        }
      } else {
        errorReporter.addErrorOn(name, kj::str(
            "'", expressionString(name), "' is not an annotation."));
      }
    }
  }